

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

void __thiscall
absl::inlined_vector_internal::
Storage<absl::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::str_format_internal::FormatArgImpl>>
::
Initialize<absl::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::str_format_internal::FormatArgImpl>,absl::str_format_internal::FormatArgImpl_const*>>
          (Storage<absl::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::str_format_internal::FormatArgImpl>>
           *this,IteratorValueAdapter<std::allocator<absl::str_format_internal::FormatArgImpl>,_const_absl::str_format_internal::FormatArgImpl_*>
                 values,SizeType<std::allocator<absl::str_format_internal::FormatArgImpl>_> new_size
          )

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Data DVar6;
  undefined8 uVar7;
  long *plVar8;
  int iVar9;
  FormatArgImpl *pFVar10;
  sbyte sVar11;
  long lVar12;
  sbyte sVar13;
  SizeType<std::allocator<absl::str_format_internal::FormatArgImpl>_> SVar14;
  ulong extraout_RDX;
  ulong uVar15;
  size_type __n;
  int iVar16;
  CordRepBtree *pCVar17;
  
  if ((*(ulong *)this & 1) == 0) {
    if (*(ulong *)this == 0) {
      if (new_size < 5) {
        if (new_size == 0) {
          lVar12 = 0;
          goto LAB_001721e3;
        }
        pFVar10 = (FormatArgImpl *)(this + 8);
      }
      else {
        __n = 8;
        if (8 < new_size) {
          __n = new_size;
        }
        pFVar10 = __gnu_cxx::new_allocator<absl::str_format_internal::FormatArgImpl>::allocate
                            ((new_allocator<absl::str_format_internal::FormatArgImpl> *)this,__n,
                             (void *)0x0);
        *(FormatArgImpl **)(this + 8) = pFVar10;
        *(size_type *)(this + 0x10) = __n;
        *this = (Storage<absl::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::str_format_internal::FormatArgImpl>>
                 )((byte)*this | 1);
      }
      lVar12 = 0;
      SVar14 = new_size;
      do {
        puVar1 = (undefined8 *)((long)&(values.it_)->data_ + lVar12);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pFVar10->data_ + lVar12);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        lVar12 = lVar12 + 0x10;
        SVar14 = SVar14 - 1;
      } while (SVar14 != 0);
      lVar12 = *(long *)this;
LAB_001721e3:
      *(SizeType<std::allocator<absl::str_format_internal::FormatArgImpl>_> *)this =
           lVar12 + new_size * 2;
      return;
    }
  }
  else {
    Initialize<absl::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::str_format_internal::FormatArgImpl>,absl::str_format_internal::FormatArgImpl_const*>>
              ();
  }
  Initialize<absl::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::str_format_internal::FormatArgImpl>,absl::str_format_internal::FormatArgImpl_const*>>
            ();
  if ((ulong)values.it_ >> 0x3b == 0) {
    operator_new((long)values.it_ << 4);
    return;
  }
  pCVar17 = (CordRepBtree *)values.it_;
  __gnu_cxx::new_allocator<absl::str_format_internal::FormatArgImpl>::allocate
            ((new_allocator<absl::str_format_internal::FormatArgImpl> *)values.it_);
  if (extraout_RDX < 0x10) {
    ((Data *)&pCVar17->super_CordRep)->buf[0] = (char)extraout_RDX * '\x02';
    if (7 < extraout_RDX) {
      DVar6 = *(Data *)&((CordRepBtree *)values.it_)->super_CordRep;
      uVar7 = *(undefined8 *)
               ((long)&((CordRepBtree *)values.it_)->super_CordRep + (extraout_RDX - 8));
      ((Data *)&pCVar17->super_CordRep)[1].ptr = (Dispatcher)0x0;
      *(Data *)((long)&pCVar17->super_CordRep + 1) = DVar6;
      *(undefined8 *)((long)&pCVar17->super_CordRep + (extraout_RDX - 7)) = uVar7;
      return;
    }
    if (3 < extraout_RDX) {
      uVar4 = *(undefined4 *)&((CordRepBtree *)values.it_)->super_CordRep;
      uVar5 = *(undefined4 *)
               ((long)&((CordRepBtree *)values.it_)->super_CordRep + (extraout_RDX - 4));
      *(undefined4 *)((long)&pCVar17->super_CordRep + 5) = 0;
      ((Data *)&pCVar17->super_CordRep)[1].ptr = (Dispatcher)0x0;
      *(undefined4 *)((long)&pCVar17->super_CordRep + 1) = uVar4;
      *(undefined4 *)((long)&pCVar17->super_CordRep + (extraout_RDX - 3)) = uVar5;
      return;
    }
    if (extraout_RDX != 0) {
      ((Data *)&pCVar17->super_CordRep)->buf[1] =
           ((Data *)&((CordRepBtree *)values.it_)->super_CordRep)->buf[0];
      ((Data *)&pCVar17->super_CordRep)->buf[(extraout_RDX >> 1) + 1] =
           ((Data *)&((CordRepBtree *)values.it_)->super_CordRep)->buf[extraout_RDX >> 1];
      ((Data *)&pCVar17->super_CordRep)->buf[extraout_RDX] =
           ((Data *)&((CordRepBtree *)values.it_)->super_CordRep)->buf[extraout_RDX - 1];
    }
    ((Data *)&pCVar17->super_CordRep)[1].ptr = (Dispatcher)0x0;
    *(undefined8 *)((long)&pCVar17->super_CordRep + extraout_RDX + 1) = 0;
    return;
  }
  cord_internal::InlineData::set_inline_data();
  if ((pCVar17->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
    __assert_fail("refcount.IsOne()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x359,"Span<char> absl::cord_internal::CordRepBtree::GetAppendBuffer(size_t)");
  }
  uVar15 = (ulong)(pCVar17->super_CordRep).storage[0];
  switch(uVar15) {
  case 0:
    goto switchD_001722d4_caseD_0;
  case 1:
    goto switchD_001722d4_caseD_1;
  case 2:
    goto switchD_001722d4_caseD_2;
  case 3:
    break;
  default:
    cord_internal::CordRepBtree::GetAppendBufferSlow(pCVar17,(size_t)values.it_);
    return;
  }
  pCVar17 = *(CordRepBtree **)
             ((pCVar17->super_CordRep).storage + (ulong)(pCVar17->super_CordRep).storage[2] * 8 + -5
             );
  if ((pCVar17->super_CordRep).tag != '\x03') goto LAB_00172439;
  if ((pCVar17->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
    return;
  }
switchD_001722d4_caseD_2:
  pCVar17 = *(CordRepBtree **)
             ((pCVar17->super_CordRep).storage + (ulong)(pCVar17->super_CordRep).storage[2] * 8 + -5
             );
  if ((pCVar17->super_CordRep).tag == '\x03') {
    if ((pCVar17->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) {
switchD_001722d4_caseD_1:
      pCVar17 = *(CordRepBtree **)
                 ((pCVar17->super_CordRep).storage +
                 (ulong)(pCVar17->super_CordRep).storage[2] * 8 + -5);
      if ((pCVar17->super_CordRep).tag != '\x03') goto LAB_00172439;
      if ((pCVar17->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) {
switchD_001722d4_caseD_0:
        plVar8 = *(long **)((pCVar17->super_CordRep).storage +
                           (ulong)(pCVar17->super_CordRep).storage[2] * 8 + -5);
        if ((int)plVar8[1] == 2) {
          bVar3 = *(byte *)((long)plVar8 + 0xc);
          if (5 < bVar3) {
            if (0xf8 < bVar3) {
              __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_flat.h"
                            ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
            }
            sVar13 = 0xc;
            if (bVar3 < 0xbb) {
              sVar13 = 6;
            }
            iVar16 = -0xb800d;
            if (bVar3 < 0xbb) {
              iVar16 = -0xe8d;
            }
            sVar11 = 3;
            if (0x42 < bVar3) {
              sVar11 = sVar13;
            }
            iVar9 = -0x1d;
            if (0x42 < bVar3) {
              iVar9 = iVar16;
            }
            pCVar17 = (CordRepBtree *)((long)(int)(((uint)bVar3 << sVar11) + iVar9) - *plVar8);
            if (pCVar17 != (CordRepBtree *)0x0) {
              if (pCVar17 < values.it_) {
                values.it_ = (FormatArgImpl *)pCVar17;
              }
              *plVar8 = (long)(((Data *)&((CordRepBtree *)values.it_)->super_CordRep)->buf + *plVar8
                              );
              (*(code *)(&DAT_001c0784 + *(int *)(&DAT_001c0784 + uVar15 * 4)))();
              return;
            }
          }
        }
      }
    }
    return;
  }
LAB_00172439:
  __assert_fail("IsBtree()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }